

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void avx::RgbToBgr(uint8_t *outY,uint8_t *inY,uint8_t *outYEnd,uint32_t rowSizeOut,
                  uint32_t rowSizeIn,uint8_t colorCount,uint32_t simdWidth,uint32_t totalSimdWidth,
                  uint32_t nonSimdWidth)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  uint8_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  
  auVar2 = _DAT_001e0d00;
  if (outY != outYEnd) {
    uVar4 = (ulong)totalSimdWidth;
    puVar7 = outY + uVar4 + 2;
    do {
      puVar3 = outY;
      puVar6 = inY;
      if (totalSimdWidth != 0) {
        uVar5 = 0;
        do {
          auVar1 = vpshufb_avx2(*(undefined1 (*) [32])(inY + uVar5),auVar2);
          *(undefined1 (*) [32])(outY + uVar5) = auVar1;
          outY[uVar5 + 0xf] = inY[uVar5 + 0x11];
          outY[uVar5 + 0x11] = inY[uVar5 + 0xf];
          uVar5 = uVar5 + simdWidth;
        } while (uVar4 != uVar5);
        puVar6 = inY + uVar5;
        puVar3 = outY + uVar4;
      }
      if ((nonSimdWidth != 0) && (puVar3 != outY + uVar4 + nonSimdWidth)) {
        uVar5 = 0;
        do {
          puVar7[uVar5] = puVar6[uVar5];
          puVar7[uVar5 - 1] = puVar6[uVar5 + 1];
          puVar7[uVar5 - 2] = puVar6[uVar5 + 2];
          uVar5 = uVar5 + colorCount;
        } while (nonSimdWidth != uVar5);
      }
      outY = outY + rowSizeOut;
      inY = inY + rowSizeIn;
      puVar7 = puVar7 + rowSizeOut;
    } while (outY != outYEnd);
  }
  return;
}

Assistant:

void RgbToBgr( uint8_t * outY, const uint8_t * inY, const uint8_t * outYEnd, uint32_t rowSizeOut, uint32_t rowSizeIn, 
                   const uint8_t colorCount, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd ctrl = _mm256_setr_epi8(2, 1, 0, 5, 4, 3, 8, 7, 6, 11, 10, 9, 14, 13, 12, 15, 
                                           16, 17, 20, 19, 18, 23, 22, 21, 26, 25, 24, 29, 28, 27, 30, 31);
        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + totalSimdWidth;

            for( ; outX != outXEnd; outX += simdWidth, inX += simdWidth ) {
                const simd * src = reinterpret_cast<const simd*> (inX);
                simd * dst = reinterpret_cast<simd*> (outX);
                simd result = _mm256_loadu_si256( src );
                result = _mm256_shuffle_epi8( result, ctrl );
                _mm256_storeu_si256( dst, result );
                *(outX + 15) = *(inX + 17);
                *(outX + 17) = *(inX + 15);
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * outXEndNonSimd = outXEnd + nonSimdWidth;
                for( ; outX != outXEndNonSimd; outX += colorCount, inX += colorCount ) {
                    *(outX + 2) = *(inX);
                    *(outX + 1) = *(inX + 1);
                    *(outX) = *(inX + 2);
                }
            }
        }
    }